

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_BXJ(DisasContext_conflict1 *s,arg_BXJ *a)

{
  _Bool _Var1;
  int iVar2;
  TCGv_i32 var;
  arg_BXJ *a_local;
  DisasContext_conflict1 *s_local;
  
  _Var1 = isar_feature_aa32_jazelle(s->isar);
  if ((_Var1) && (iVar2 = arm_dc_feature(s,9), iVar2 == 0)) {
    var = load_reg(s,a->rm);
    gen_bx(s,var);
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_BXJ(DisasContext *s, arg_BXJ *a)
{
    if (!ENABLE_ARCH_5J || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    /* Trivial implementation equivalent to bx.  */
    gen_bx(s, load_reg(s, a->rm));
    return true;
}